

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O3

void test_cpp_add_range(void **param_1)

{
  ulong uVar1;
  _Bool _Var2;
  pointer ppVar3;
  ulong uVar4;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> __l;
  Roaring r2;
  Roaring r1;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ranges;
  roaring_array_t local_a8;
  roaring_bitmap_t local_78;
  undefined8 local_50;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_48;
  
  local_78.high_low_container.size = 1;
  local_78.high_low_container.allocation_size = 0;
  local_78.high_low_container.containers = (void **)0x5;
  local_78.high_low_container.keys = (uint16_t *)0x1;
  local_78.high_low_container.typecodes = (uint8_t *)0x1;
  local_78.high_low_container.flags = '\x02';
  local_78.high_low_container._33_7_ = 0;
  local_50 = 1;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_78;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_48,__l,(allocator_type *)&local_a8);
  if (local_48.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar3 = local_48.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar4 = ppVar3->first;
      uVar1 = ppVar3->second;
      local_78.high_low_container.keys = (uint16_t *)0x0;
      local_78.high_low_container.typecodes = (uint8_t *)0x0;
      local_78.high_low_container.size = 0;
      local_78.high_low_container.allocation_size = 0;
      local_78.high_low_container.containers = (void **)0x0;
      local_78.high_low_container.flags = '\0';
      local_78.high_low_container._33_7_ = 0;
      roaring_bitmap_init_with_capacity(&local_78,0);
      roaring_bitmap_add_range_closed(&local_78,(uint32_t)uVar4,(uint32_t)uVar1);
      local_a8.keys = (uint16_t *)0x0;
      local_a8.typecodes = (uint8_t *)0x0;
      local_a8.size = 0;
      local_a8.allocation_size = 0;
      local_a8.containers = (container_s **)0x0;
      local_a8.flags = '\0';
      local_a8._33_7_ = 0;
      roaring_bitmap_init_with_capacity((roaring_bitmap_t *)&local_a8,0);
      for (; uVar4 <= uVar1; uVar4 = uVar4 + 1) {
        roaring_bitmap_add((roaring_bitmap_t *)&local_a8,(uint32_t)uVar4);
      }
      _Var2 = roaring_bitmap_equals(&local_78,(roaring_bitmap_t *)&local_a8);
      _assert_true((ulong)_Var2,"r1 == r2",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
                   ,0x2ec);
      roaring::Roaring::~Roaring((Roaring *)&local_a8);
      roaring::Roaring::~Roaring((Roaring *)&local_78);
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != local_48.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_48.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_range) {
    std::vector<std::pair<uint64_t, uint64_t>> ranges = {
        {1, 5},
        {1, 1},
        {2, 1},
    };
    for (const auto &range : ranges) {
        uint64_t min = range.first;
        uint64_t max = range.second;
        Roaring r1;
        r1.addRangeClosed(min, max);
        Roaring r2;
        for (uint64_t v = min; v <= max; ++v) {
            r2.add(v);
        }
        assert_true(r1 == r2);
    }
}